

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

bool ON_DimStyle::Internal_EqualOverrideParentFields(ON_DimStyle *a,ON_DimStyle *b)

{
  bool local_19;
  ON_DimStyle *b_local;
  ON_DimStyle *a_local;
  
  local_19 = false;
  if ((((a->m_field_override_parent_count == b->m_field_override_parent_count) &&
       (local_19 = false, a->m_field_override_parent_bits0 == b->m_field_override_parent_bits0)) &&
      (local_19 = false, a->m_field_override_parent_bits1 == b->m_field_override_parent_bits1)) &&
     (local_19 = false, a->m_field_override_parent_bits2 == b->m_field_override_parent_bits2)) {
    local_19 = a->m_field_override_parent_bits3 == b->m_field_override_parent_bits3;
  }
  return local_19;
}

Assistant:

bool ON_DimStyle::Internal_EqualOverrideParentFields(
    const ON_DimStyle& a,
    const ON_DimStyle& b
  )
{
  return (
    a.m_field_override_parent_count == b.m_field_override_parent_count
    && a.m_field_override_parent_bits0 == b.m_field_override_parent_bits0
    && a.m_field_override_parent_bits1 == b.m_field_override_parent_bits1
    && a.m_field_override_parent_bits2 == b.m_field_override_parent_bits2
    && a.m_field_override_parent_bits3 == b.m_field_override_parent_bits3
    );
}